

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::rebuildOrderHeap(Solver *this)

{
  int local_1c;
  
  if (((this->trail_lim).sz != 0) ||
     ((this->trail).sz + (this->order_heap->heap).sz < (this->vardata).sz)) {
    if ((this->decision_rebuild_vars).data != (int *)0x0) {
      (this->decision_rebuild_vars).sz = 0;
    }
    local_1c = 0;
    if (0 < (this->vardata).sz) {
      do {
        if (((this->decision).data[local_1c] != '\0') &&
           (((this->assigns).data[local_1c].value & 2) != 0)) {
          vec<int>::push(&this->decision_rebuild_vars,&local_1c);
        }
        local_1c = local_1c + 1;
      } while (local_1c < (this->vardata).sz);
    }
    Heap<Minisat::Solver::VarOrderLt>::build(this->order_heap,&this->decision_rebuild_vars);
    this->full_heap_size = (this->order_heap->heap).sz;
  }
  return;
}

Assistant:

void Solver::rebuildOrderHeap()
{
    /* all unassigned variables present, no need to rebuild */
    if (decisionLevel() == 0 && (order_heap->size() + trail.size() >= nVars())) {
        TRACE(for (Var v = 0; v < nVars(); v++) {
            assert((!decision[v] || value(v) != l_Undef || order_heap->inHeap(v)) &&
                   "unassigned variables have to be present in the heap");
        });
        return;
    }

    decision_rebuild_vars.clear();
    for (Var v = 0; v < nVars(); v++)
        if (decision[v] && value(v) == l_Undef) decision_rebuild_vars.push(v);

    order_heap->build(decision_rebuild_vars);
    full_heap_size = order_heap->size();
}